

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O0

GenFuncs<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
* deqp::gls::BuiltinPrecisionTests::
  makeVectorizedFuncs<deqp::gls::BuiltinPrecisionTests::Functions::Exp2>(void)

{
  Exp2 *func_;
  GenFunc<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_2>
  *func2_;
  GenFunc<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_3>
  *func3_;
  GenFunc<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_4>
  *func4_;
  GenFuncs<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *in_RDI;
  
  func_ = instance<deqp::gls::BuiltinPrecisionTests::Functions::Exp2>();
  func2_ = &instance<deqp::gls::BuiltinPrecisionTests::VectorizedFunc<deqp::gls::BuiltinPrecisionTests::Functions::Exp2,2>>
                      ()->
            super_GenFunc<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_2>
  ;
  func3_ = &instance<deqp::gls::BuiltinPrecisionTests::VectorizedFunc<deqp::gls::BuiltinPrecisionTests::Functions::Exp2,3>>
                      ()->
            super_GenFunc<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_3>
  ;
  func4_ = &instance<deqp::gls::BuiltinPrecisionTests::VectorizedFunc<deqp::gls::BuiltinPrecisionTests::Functions::Exp2,4>>
                      ()->
            super_GenFunc<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_4>
  ;
  GenFuncs<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  ::GenFuncs(in_RDI,(Func<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
                     *)func_,func2_,func3_,func4_);
  return in_RDI;
}

Assistant:

GenFuncs<typename F::Sig> makeVectorizedFuncs (void)
{
	return GenFuncs<typename F::Sig>(instance<F>(),
									 instance<VectorizedFunc<F, 2> >(),
									 instance<VectorizedFunc<F, 3> >(),
									 instance<VectorizedFunc<F, 4> >());
}